

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O0

status_register_t * get_spsr(arm7tdmi_t *state)

{
  arm7tdmi_t *state_local;
  status_register_t *local_8;
  
  switch((state->cpsr).raw & 0x1f) {
  case 0x11:
    local_8 = &state->spsr_fiq;
    break;
  case 0x12:
    local_8 = &state->spsr_irq;
    break;
  case 0x13:
    local_8 = &state->spsr_svc;
    break;
  default:
    local_8 = &state->spsr;
    break;
  case 0x17:
    local_8 = &state->spsr_abt;
    break;
  case 0x1b:
    local_8 = &state->spsr_und;
  }
  return local_8;
}

Assistant:

status_register_t* get_spsr(arm7tdmi_t* state) {
    switch (state->cpsr.mode) {
        case MODE_FIQ:
            return &state->spsr_fiq;
        case MODE_SUPERVISOR:
            return &state->spsr_svc;
        case MODE_ABORT:
            return &state->spsr_abt;
        case MODE_IRQ:
            return &state->spsr_irq;
        case MODE_UNDEFINED:
            return &state->spsr_und;
        default:
            return &state->spsr;
    }
}